

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type __thiscall
duckdb::Deserializer::Read<duckdb_parquet::CompressionCodec::type>(Deserializer *this)

{
  long *in_RDI;
  char *in_stack_00000008;
  string str;
  string local_30 [44];
  type local_4;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_4 = Read<unsigned_int>((Deserializer *)0x674a32);
  }
  else {
    (**(code **)(*in_RDI + 0xd0))();
    std::__cxx11::string::c_str();
    local_4 = EnumUtil::FromString<duckdb_parquet::CompressionCodec::type>(in_stack_00000008);
    std::__cxx11::string::~string(local_30);
  }
  return local_4;
}

Assistant:

inline typename std::enable_if<std::is_enum<T>::value, T>::type Read() {
		if (deserialize_enum_from_string) {
			auto str = ReadString();
			return EnumUtil::FromString<T>(str.c_str());
		} else {
			return (T)Read<typename std::underlying_type<T>::type>();
		}
	}